

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

ostream * ccd::Json::operator<<(ostream *os,Value *val)

{
  bool bVar1;
  int iVar2;
  variant_alternative_t<4UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *obj;
  ostream *poVar3;
  variant_alternative_t<3UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *pvVar4;
  variant_alternative_t<5UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *array;
  char *pcVar5;
  double dVar6;
  
  poVar3 = os;
  switch(val->m_type) {
  case Int:
    iVar2 = Value::operator_cast_to_int(val);
    std::ostream::operator<<((ostream *)os,iVar2);
    break;
  case Double:
    dVar6 = Value::operator_cast_to_double(val);
    std::ostream::_M_insert<double>(dVar6);
    break;
  case Bool:
    bVar1 = Value::operator_cast_to_bool(val);
    pcVar5 = "false";
    if (bVar1) {
      pcVar5 = "true";
    }
    goto LAB_00116f61;
  case String:
    poVar3 = std::operator<<(os,"\"");
    pvVar4 = std::
             get<3ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                       (&val->m_value);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    pcVar5 = "\"";
    goto LAB_00116f61;
  case Object:
    obj = std::
          get<4ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                    (&val->m_value);
    operator<<(os,obj);
    break;
  case Array:
    array = std::
            get<5ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                      (&val->m_value);
    operator<<(os,array);
    break;
  case Null:
    pcVar5 = "null";
LAB_00116f61:
    std::operator<<(poVar3,pcVar5);
  }
  return os;
}

Assistant:

std::ostream & operator<< ( std::ostream & os, const Value& val )
{
	switch ( val.type() ) {
	case Value::Type::Int:
		os << static_cast<int>(val);
		break;
	case Value::Type::Double:
		os << static_cast<double>(val);
		break;
	case Value::Type::Bool:
		os << ( static_cast<bool>(val)?"true":"false" );
		break;
	case Value::Type::String:
		os << "\"" << static_cast<const std::string&>(val) << "\"";
		break;
	case Value::Type::Object:
		os << static_cast<const Object&>(val);
		break;
	case Value::Type::Array:
		os << static_cast<const Array&>(val);
		break;
	case Value::Type::Null:
		os << "null";
		break;
	default:
		break;
	}
	return os;
}